

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Union * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
          (Arena *this,Group *params)

{
  Union *ptr;
  
  ptr = (Union *)allocateBytes(this,0x58,8,true);
  ptr->parent = &params->super_StructOrGroup;
  ptr->groupCount = 0;
  (ptr->discriminantOffset).ptr.isSet = false;
  (ptr->dataLocations).builder.ptr = (DataLocation *)0x0;
  (ptr->dataLocations).builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)0x0;
  (ptr->dataLocations).builder.endPtr = (DataLocation *)0x0;
  (ptr->pointerLocations).builder.ptr = (uint *)0x0;
  (ptr->pointerLocations).builder.pos = (RemoveConst<unsigned_int> *)0x0;
  (ptr->pointerLocations).builder.endPtr = (uint *)0x0;
  setDestructor(this,ptr,destroyObject<capnp::compiler::NodeTranslator::StructLayout::Union>);
  return ptr;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}